

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O1

int arkRootfind(void *arkode_mem)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  realtype t;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (arkode_mem == (void *)0x0) {
    iVar7 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkRootfind","arkode_mem = NULL illegal.");
  }
  else {
    puVar1 = *(undefined8 **)((long)arkode_mem + 0x280);
    uVar8 = (ulong)*(int *)(puVar1 + 1);
    if ((long)uVar8 < 1) {
      uVar12 = 0;
      bVar6 = true;
      bVar5 = true;
    }
    else {
      uVar10 = 0;
      bVar5 = false;
      bVar6 = false;
      uVar12 = 0;
      dVar17 = 0.0;
      do {
        if (*(int *)(puVar1[0xe] + uVar10 * 4) != 0) {
          dVar16 = *(double *)(puVar1[8] + uVar10 * 8);
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            dVar19 = *(double *)(puVar1[7] + uVar10 * 8);
            if ((dVar16 * dVar19 < 0.0) &&
               (((double)*(int *)(puVar1[3] + uVar10 * 4) * dVar19 <= 0.0 &&
                (dVar16 = ABS(dVar16 / (dVar16 - dVar19)), dVar17 < dVar16)))) {
              bVar5 = true;
              uVar12 = uVar10 & 0xffffffff;
              dVar17 = dVar16;
            }
          }
          else if ((double)*(int *)(puVar1[3] + uVar10 * 4) * *(double *)(puVar1[7] + uVar10 * 8) <=
                   0.0) {
            bVar6 = true;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
      bVar5 = !bVar5;
      bVar6 = !bVar6;
    }
    if (bVar5) {
      puVar1[6] = puVar1[5];
      if (0 < *(int *)(puVar1 + 1)) {
        lVar2 = puVar1[8];
        lVar3 = puVar1[9];
        uVar12 = 0;
        do {
          *(undefined8 *)(lVar3 + uVar12 * 8) = *(undefined8 *)(lVar2 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
      }
      iVar7 = 0;
      if ((!bVar6) && (iVar7 = 1, 0 < *(int *)(puVar1 + 1))) {
        lVar2 = puVar1[2];
        lVar3 = puVar1[0xe];
        lVar11 = 0;
        do {
          *(undefined4 *)(lVar2 + lVar11 * 4) = 0;
          if (((*(int *)(lVar3 + lVar11 * 4) != 0) &&
              (dVar17 = *(double *)(puVar1[8] + lVar11 * 8), dVar17 == 0.0)) && (!NAN(dVar17))) {
            *(uint *)(lVar2 + lVar11 * 4) =
                 (uint)(*(double *)(puVar1[7] + lVar11 * 8) <= 0.0) * 2 + -1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)(puVar1 + 1));
      }
    }
    else {
      dVar17 = (double)puVar1[4];
      dVar16 = (double)puVar1[5];
      dVar15 = dVar16 - dVar17;
      dVar18 = ABS(dVar15);
      dVar19 = (double)puVar1[0xb];
      if (dVar19 < dVar18) {
        dVar21 = 1.0;
        dVar20 = 0.5;
        iVar7 = -1;
        iVar14 = 0;
        do {
          if (iVar7 == iVar14) {
            dVar21 = dVar21 * dVar20;
          }
          else {
            dVar21 = 1.0;
          }
          dVar20 = *(double *)(puVar1[8] + (long)(int)uVar12 * 8);
          t = dVar16 - (dVar15 * dVar20) /
                       (dVar20 - *(double *)(puVar1[7] + (long)(int)uVar12 * 8) * dVar21);
          if (ABS(t - dVar17) < dVar19 * 0.5) {
            uVar8 = -(ulong)(5.0 < dVar18 / dVar19);
            t = (double)(uVar8 & 0x3fb999999999999a | ~uVar8 & (ulong)(0.5 / (dVar18 / dVar19))) *
                dVar15 + dVar17;
          }
          if (ABS(dVar16 - t) < dVar19 * 0.5) {
            uVar8 = -(ulong)(5.0 < dVar18 / dVar19);
            t = (double)(uVar8 & 0xbfb999999999999a | ~uVar8 & (ulong)(-0.5 / (dVar18 / dVar19))) *
                dVar15 + dVar16;
          }
          arkGetDky((ARKodeMem)arkode_mem,t,0,*(N_Vector *)((long)arkode_mem + 0x108));
          iVar7 = (*(code *)*puVar1)(t,*(undefined8 *)((long)arkode_mem + 0x108),puVar1[9],
                                     puVar1[0x10]);
          puVar1[0xd] = puVar1[0xd] + 1;
          if (iVar7 != 0) {
            return -0xc;
          }
          iVar7 = *(int *)(puVar1 + 1);
          uVar8 = (ulong)iVar7;
          if ((long)uVar8 < 1) {
            bVar6 = true;
            bVar5 = true;
          }
          else {
            dVar17 = 0.0;
            uVar10 = 0;
            bVar5 = false;
            bVar6 = false;
            do {
              if (*(int *)(puVar1[0xe] + uVar10 * 4) != 0) {
                dVar16 = *(double *)(puVar1[9] + uVar10 * 8);
                if ((dVar16 != 0.0) || (NAN(dVar16))) {
                  dVar19 = *(double *)(puVar1[7] + uVar10 * 8);
                  if ((dVar16 * dVar19 < 0.0) &&
                     (((double)*(int *)(puVar1[3] + uVar10 * 4) * dVar19 <= 0.0 &&
                      (dVar16 = ABS(dVar16 / (dVar16 - dVar19)), dVar17 < dVar16)))) {
                    bVar5 = true;
                    uVar12 = uVar10 & 0xffffffff;
                    dVar17 = dVar16;
                  }
                }
                else if ((double)*(int *)(puVar1[3] + uVar10 * 4) *
                         *(double *)(puVar1[7] + uVar10 * 8) <= 0.0) {
                  bVar6 = true;
                }
              }
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
            bVar5 = !bVar5;
            bVar6 = !bVar6;
          }
          if (bVar5) {
            if (!bVar6) {
              puVar1[5] = t;
              if (0 < iVar7) {
                lVar2 = puVar1[8];
                lVar3 = puVar1[9];
                uVar12 = 0;
                do {
                  *(undefined8 *)(lVar2 + uVar12 * 8) = *(undefined8 *)(lVar3 + uVar12 * 8);
                  uVar12 = uVar12 + 1;
                } while (uVar8 != uVar12);
              }
              break;
            }
            puVar1[4] = t;
            if (0 < iVar7) {
              lVar2 = puVar1[7];
              lVar3 = puVar1[9];
              uVar10 = 0;
              do {
                *(undefined8 *)(lVar2 + uVar10 * 8) = *(undefined8 *)(lVar3 + uVar10 * 8);
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
            }
            iVar9 = 2;
            dVar20 = 2.0;
            if (ABS((double)puVar1[5] - (double)puVar1[4]) <= (double)puVar1[0xb]) break;
          }
          else {
            puVar1[5] = t;
            if (0 < iVar7) {
              lVar2 = puVar1[8];
              lVar3 = puVar1[9];
              uVar10 = 0;
              do {
                *(undefined8 *)(lVar2 + uVar10 * 8) = *(undefined8 *)(lVar3 + uVar10 * 8);
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
            }
            iVar9 = 1;
            dVar20 = 0.5;
            if (ABS((double)puVar1[5] - (double)puVar1[4]) <= (double)puVar1[0xb]) break;
          }
          dVar17 = (double)puVar1[4];
          dVar16 = (double)puVar1[5];
          dVar15 = dVar16 - dVar17;
          dVar18 = ABS(dVar15);
          dVar19 = (double)puVar1[0xb];
          iVar7 = iVar14;
          iVar14 = iVar9;
        } while (dVar19 < dVar18);
      }
      puVar1[6] = puVar1[5];
      iVar7 = 1;
      if (0 < *(int *)(puVar1 + 1)) {
        lVar2 = puVar1[2];
        lVar3 = puVar1[8];
        lVar11 = puVar1[9];
        lVar4 = puVar1[0xe];
        lVar13 = 0;
        do {
          *(undefined8 *)(lVar11 + lVar13 * 8) = *(undefined8 *)(lVar3 + lVar13 * 8);
          *(undefined4 *)(lVar2 + lVar13 * 4) = 0;
          if (*(int *)(lVar4 + lVar13 * 4) != 0) {
            dVar17 = *(double *)(lVar3 + lVar13 * 8);
            if (((dVar17 == 0.0) && (!NAN(dVar17))) &&
               (dVar16 = *(double *)(puVar1[7] + lVar13 * 8),
               (double)*(int *)(puVar1[3] + lVar13 * 4) * dVar16 <= 0.0)) {
              *(uint *)(lVar2 + lVar13 * 4) = (uint)(dVar16 <= 0.0) * 2 + -1;
            }
            dVar16 = *(double *)(puVar1[7] + lVar13 * 8);
            if ((dVar17 * dVar16 < 0.0) &&
               ((double)*(int *)(puVar1[3] + lVar13 * 4) * dVar16 <= 0.0)) {
              *(uint *)(lVar2 + lVar13 * 4) = (uint)(dVar16 <= 0.0) * 2 + -1;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(puVar1 + 1));
      }
    }
  }
  return iVar7;
}

Assistant:

int arkRootfind(void* arkode_mem)
{
  realtype alpha, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  booleantype zroot, sgnchg;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootfind", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  rootmem = ark_mem->root_mem;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot = SUNFALSE;
  sgnchg = SUNFALSE;
  for (i = 0;  i < rootmem->nrtfn; i++) {
    if (!rootmem->gactive[i]) continue;
    if (SUNRabs(rootmem->ghi[i]) == ZERO) {
      if (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) {
        zroot = SUNTRUE;
      }
    } else {
      if ( (rootmem->glo[i]*rootmem->ghi[i] < ZERO) &&
           (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) ) {
        gfrac = SUNRabs(rootmem->ghi[i]/(rootmem->ghi[i] - rootmem->glo[i]));
        if (gfrac > maxfrac) {
          sgnchg = SUNTRUE;
          maxfrac = gfrac;
          imax = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     ARK_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg) {
    rootmem->trout = rootmem->thi;
    for (i = 0; i < rootmem->nrtfn; i++)
      rootmem->grout[i] = rootmem->ghi[i];
    if (!zroot) return(ARK_SUCCESS);
    for (i = 0; i < rootmem->nrtfn; i++) {
      rootmem->iroots[i] = 0;
      if (!rootmem->gactive[i]) continue;
      if (SUNRabs(rootmem->ghi[i]) == ZERO)
        rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
    }
    return(RTFOUND);
  }

  /* Initialize alpha to avoid compiler warning */
  alpha = ONE;

  /* A sign change was found.  Loop to locate nearest root. */
  side = 0;  sideprev = -1;
  for(;;) {                                    /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) break;

    /* Set weight alpha.
       On the first two passes, set alpha = 1.  Thereafter, reset alpha
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alpha = 1.
       If the sides were the same, then double alpha (if high side),
       or halve alpha (if low side).
       The next guess tmid is the secant method value if alpha = 1, but
       is closer to tlo if alpha < 1, and closer to thi if alpha > 1.    */
    if (sideprev == side) {
      alpha = (side == 2) ? alpha*TWO : alpha*HALF;
    } else {
      alpha = ONE;
    }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = rootmem->thi - (rootmem->thi - rootmem->tlo) *
      rootmem->ghi[imax]/(rootmem->ghi[imax] - alpha*rootmem->glo[imax]);
    if (SUNRabs(tmid - rootmem->tlo) < HALF*rootmem->ttol) {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo)/rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF/fracint;
      tmid = rootmem->tlo + fracsub*(rootmem->thi - rootmem->tlo);
    }
    if (SUNRabs(rootmem->thi - tmid) < HALF*rootmem->ttol) {
      fracint = SUNRabs(rootmem->thi - rootmem->tlo)/rootmem->ttol;
      fracsub = (fracint > FIVE) ? TENTH : HALF/fracint;
      tmid = rootmem->thi - fracsub*(rootmem->thi - rootmem->tlo);
    }

    (void) arkGetDky(ark_mem, tmid, 0, ark_mem->ycur);
    retval = rootmem->gfun(tmid, ark_mem->ycur, rootmem->grout,
                           rootmem->root_data);
    rootmem->nge++;
    if (retval != 0) return(ARK_RTFUNC_FAIL);

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac = ZERO;
    zroot = SUNFALSE;
    sgnchg = SUNFALSE;
    sideprev = side;
    for (i = 0;  i < rootmem->nrtfn; i++) {
      if (!rootmem->gactive[i]) continue;
      if (SUNRabs(rootmem->grout[i]) == ZERO) {
        if (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) {
          zroot = SUNTRUE;
        }
      } else {
        if ( (rootmem->glo[i]*rootmem->grout[i] < ZERO) &&
             (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) ) {
          gfrac = SUNRabs(rootmem->grout[i]/(rootmem->grout[i] - rootmem->glo[i]));
          if (gfrac > maxfrac) {
            sgnchg = SUNTRUE;
            maxfrac = gfrac;
            imax = i;
          }
        }
      }
    }
    if (sgnchg) {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
        rootmem->ghi[i] = rootmem->grout[i];
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol) break;
      continue;  /* Return to looping point. */
    }

    if (zroot) {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      rootmem->thi = tmid;
      for (i = 0; i < rootmem->nrtfn; i++)
        rootmem->ghi[i] = rootmem->grout[i];
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    rootmem->tlo = tmid;
    for (i = 0; i < rootmem->nrtfn; i++)
      rootmem->glo[i] = rootmem->grout[i];
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(rootmem->thi - rootmem->tlo) <= rootmem->ttol)
      break;

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  rootmem->trout = rootmem->thi;
  for (i = 0; i < rootmem->nrtfn; i++) {
    rootmem->grout[i] = rootmem->ghi[i];
    rootmem->iroots[i] = 0;
    if (!rootmem->gactive[i]) continue;
    if ( (SUNRabs(rootmem->ghi[i]) == ZERO) &&
         (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) )
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
    if ( (rootmem->glo[i]*rootmem->ghi[i] < ZERO) &&
         (rootmem->rootdir[i]*rootmem->glo[i] <= ZERO) )
      rootmem->iroots[i] = rootmem->glo[i] > 0 ? -1:1;
  }
  return(RTFOUND);
}